

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependanceestimator.cxx
# Opt level: O3

int __thiscall DependanceEstimator::init(DependanceEstimator *this,EVP_PKEY_CTX *ctx)

{
  size_t __n;
  int iVar1;
  uint uVar2;
  double **ppdVar3;
  int in_EAX;
  void *pvVar4;
  void *extraout_RAX;
  long lVar5;
  long lVar6;
  double dVar7;
  
  (this->super_Estimator).nSamples = 0;
  iVar1 = this->dependanceBins;
  lVar6 = (long)iVar1;
  if (0 < lVar6) {
    __n = lVar6 * 8;
    pvVar4 = memset(this->aSamples,0,__n);
    uVar2 = (this->super_Estimator).nEstimate;
    pvVar4 = (void *)((ulong)pvVar4 & 0xffffffffffffff00);
    if ((uVar2 & 4) != 0 && 0 < iVar1) {
      pvVar4 = memset(this->aOne,0,__n);
    }
    pvVar4 = (void *)((ulong)pvVar4 & 0xffffffffffffff00);
    if ((uVar2 & 8) != 0 && 0 < iVar1) {
      pvVar4 = memset(this->aTwo,0,__n);
    }
    pvVar4 = (void *)((ulong)pvVar4 & 0xffffffffffffff00);
    if ((uVar2 & 0x10) != 0 && 0 < iVar1) {
      pvVar4 = memset(this->aThree,0,__n);
    }
    in_EAX = (int)CONCAT71((int7)((ulong)pvVar4 >> 8),iVar1 < 1);
    if ((uVar2 & 2) != 0 && 0 < iVar1) {
      dVar7 = ceil((this->dDistEnd - this->dDistBegin) / this->dDistDelta);
      ppdVar3 = this->aDist;
      lVar5 = 0;
      pvVar4 = extraout_RAX;
      do {
        if (0 < (int)dVar7) {
          pvVar4 = memset(ppdVar3[lVar5],0,(ulong)(uint)(int)dVar7 * 8);
        }
        in_EAX = (int)pvVar4;
        lVar5 = lVar5 + 1;
      } while (lVar6 != lVar5);
    }
  }
  return in_EAX;
}

Assistant:

void DependanceEstimator::init()
{
	nSamples = 0;
	for(int i=0; i<dependanceBins; i++)
		aSamples[i] = 0.0;
	if(nEstimate & EST_MEAN)
		for(int i=0; i<dependanceBins; i++)
			aOne[i] = 0.0;
	if(nEstimate & EST_VAR)
		for(int i=0; i<dependanceBins; i++)
			aTwo[i] = 0.0;
	if(nEstimate & EST_CUR)
		for(int i=0; i<dependanceBins; i++)
			aThree[i] = 0.0;
	if(nEstimate & EST_DENS) {
		int distBins = int(ceil((dDistEnd - dDistBegin) / dDistDelta));
		for( int i=0; i<dependanceBins; i++ )
			for( int j=0; j<distBins; j++ )
				aDist[i][j] = 0.0;
	}
}